

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O0

locator * __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_set_types<void_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<void_const*,void>,std::equal_to<void_const*>,std::allocator<void_const*>>
::unchecked_emplace_with_rehash<void_const*>
          (table_core<boost::unordered::detail::foa::flat_set_types<const_void_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_void_*,_void>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
           *this,size_t hash,void **args)

{
  arrays_type *in_RCX;
  table_core<boost::unordered::detail::foa::flat_set_types<const_void_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_void_*,_void>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
  *in_RDX;
  size_t in_RSI;
  arrays_type *in_RDI;
  locator *it;
  arrays_type new_arrays_;
  arrays_type *arrays_;
  table_core<boost::unordered::detail::foa::flat_set_types<const_void_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_void_*,_void>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
  *in_stack_ffffffffffffffa0;
  group15<boost::unordered::detail::foa::plain_integral> *local_50;
  size_t local_48;
  group_type_pointer in_stack_ffffffffffffffc0;
  size_t in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  arrays_type *in_stack_ffffffffffffffd8;
  table_core<boost::unordered::detail::foa::flat_set_types<const_void_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_void_*,_void>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
  *in_stack_ffffffffffffffe0;
  
  arrays_ = in_RDI;
  table_core<boost::unordered::detail::foa::flat_set_types<const_void_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_void_*,_void>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
  ::new_arrays_for_growth(in_stack_ffffffffffffffa0);
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_const_void_*>
  ::table_locator((table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_const_void_*>
                   *)in_RDI);
  table_core<boost::unordered::detail::foa::flat_set_types<const_void_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_void_*,_void>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
  ::position_for(in_RSI,arrays_);
  nosize_unchecked_emplace_at<void_const*>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
             in_stack_ffffffffffffffc8,(void **)in_stack_ffffffffffffffc0);
  in_RDI->groups_size_index = (size_t)local_50;
  in_RDI->groups_size_mask = local_48;
  in_RDI->groups_ = in_stack_ffffffffffffffc0;
  table_core<boost::unordered::detail::foa::flat_set_types<const_void_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_void_*,_void>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
  ::unchecked_rehash(in_RDX,in_RCX);
  *(long *)(in_RSI + 0x28) = *(long *)(in_RSI + 0x28) + 1;
  return (locator *)arrays_;
}

Assistant:

BOOST_NOINLINE locator unchecked_emplace_with_rehash(std::size_t hash, Args&&... args) {
        auto new_arrays_ = new_arrays_for_growth();
        locator it;
        BOOST_TRY {
            /* strong exception guarantee -> try insertion before rehash */
            it = nosize_unchecked_emplace_at(new_arrays_, position_for(hash, new_arrays_), hash,
                                             std::forward<Args>(args)...);
        }